

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_gethostname.c
# Opt level: O3

int Curl_gethostname(char *name,size_t namelen)

{
  int iVar1;
  char *pcVar2;
  
  *name = '\0';
  iVar1 = gethostname(name,namelen);
  name[namelen - 1] = '\0';
  if (iVar1 == 0) {
    pcVar2 = strchr(name,0x2e);
    if (pcVar2 != (char *)0x0) {
      *pcVar2 = '\0';
    }
  }
  return iVar1;
}

Assistant:

int Curl_gethostname(char * const name, GETHOSTNAME_TYPE_ARG2 namelen)
{
#ifndef HAVE_GETHOSTNAME

  /* Allow compilation and return failure when unavailable */
  (void) name;
  (void) namelen;
  return -1;

#else
  int err;
  char *dot;

#ifdef DEBUGBUILD

  /* Override hostname when environment variable CURL_GETHOSTNAME is set */
  const char *force_hostname = getenv("CURL_GETHOSTNAME");
  if(force_hostname) {
    if(strlen(force_hostname) < (size_t)namelen)
      strcpy(name, force_hostname);
    else
      return 1; /* can't do it */
    err = 0;
  }
  else {
    name[0] = '\0';
    err = gethostname(name, namelen);
  }

#else /* DEBUGBUILD */

  name[0] = '\0';
#ifdef __AMIGA__
  err = gethostname((unsigned char *)name, namelen);
#else
  err = gethostname(name, namelen);
#endif

#endif

  name[namelen - 1] = '\0';

  if(err)
    return err;

  /* Truncate domain, leave only machine name */
  dot = strchr(name, '.');
  if(dot)
    *dot = '\0';

  return 0;
#endif

}